

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>>>
::emplace_at<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>>>
           *this,iterator iter,piecewise_construct_t *args,
          tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *args_1,tuple<> *args_2)

{
  bool bVar1;
  reference args_00;
  FindElement local_50;
  iterator local_48;
  iterator local_38;
  iterator local_28;
  
  local_38.field_1 = iter.field_1;
  local_38.ctrl_ = iter.ctrl_;
  construct<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<>>
            (this,local_38.field_1.slot_,args,args_1,args_2);
  local_50.s = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                *)this;
  args_00 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
            ::iterator::operator*(&local_38);
  local_28 = (iterator)
             DecomposePair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>>>::FindElement,std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>&>
                       (&local_50,args_00);
  local_48.ctrl_ = local_38.ctrl_;
  local_48.field_1.slot_ = (slot_type *)local_38.field_1;
  bVar1 = container_internal::operator==(&local_28,&local_48);
  if (bVar1) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xfe2,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>, Args = <const std::piecewise_construct_t &, std::tuple<const std::basic_string<char> &>, std::tuple<>>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }